

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  LazyStat<Catch::GroupInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentGroupInfo,groupInfo);
  std::__cxx11::string::string((string *)&local_38,"Group",&local_59);
  XmlWriter::startElement(&this->m_xml,&local_38,Newline|Indent);
  std::__cxx11::string::string((string *)&local_58,"name",&local_5a);
  XmlWriter::writeAttribute(&this->m_xml,&local_58,&groupInfo->name);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void XmlReporter::testGroupStarting( GroupInfo const& groupInfo ) {
        StreamingReporterBase::testGroupStarting( groupInfo );
        m_xml.startElement( "Group" )
            .writeAttribute( "name", groupInfo.name );
    }